

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ArgSortLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_argsort(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x5b5) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5b5;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ArgSortLayerParams::ArgSortLayerParams(this_00.argsort_);
    (this->layer_).argsort_ = (ArgSortLayerParams *)this_00;
  }
  return (ArgSortLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgSortLayerParams* NeuralNetworkLayer::mutable_argsort() {
  if (!has_argsort()) {
    clear_layer();
    set_has_argsort();
    layer_.argsort_ = new ::CoreML::Specification::ArgSortLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.argSort)
  return layer_.argsort_;
}